

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::looksLikeInteger(string *string)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined1 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t index;
  size_type in_stack_ffffffffffffffd8;
  undefined1 *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  bool local_1;
  
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6c9f53);
  if (bVar2) {
    local_1 = false;
  }
  else {
    local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if ((*pvVar3 == '-') ||
       (pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), *pvVar3 == '+')) {
      local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    }
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    bVar2 = isDigitCharacter(*pvVar3);
    if (bVar2) {
      do {
        pbVar1 = local_18;
        local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar1->_M_dataplus)._M_p + 1);
        this = local_18;
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length(in_RDI);
        if (pbVar4 <= this) {
          return true;
        }
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (this,in_stack_ffffffffffffffd8);
        bVar2 = isDigitCharacter(*pvVar3);
      } while (bVar2);
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](this,in_stack_ffffffffffffffd8);
      if (((*pvVar3 == '.') ||
          (pvVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                              (this,in_stack_ffffffffffffffd8), *pvVar3 == 'e')) ||
         (pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (this,in_stack_ffffffffffffffd8), *pvVar3 == 'E')) {
        __pos = (undefined1 *)((long)&(pbVar1->_M_dataplus)._M_p + 2);
        puVar5 = (undefined1 *)
                 CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length(in_RDI);
        if (__pos < puVar5) {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (this,(size_type)__pos);
          bVar2 = isDigitCharacter(*pvVar3);
          if (((bVar2) ||
              (pvVar3 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator[](this,(size_type)__pos), *pvVar3 == '-')) ||
             (pvVar3 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (this,(size_type)__pos), *pvVar3 == '+')) {
            return false;
          }
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool looksLikeInteger(const std::string& string)
{
    if (string.empty()) {
        // LCOV_EXCL_START
        return false;
        // LCOV_EXCL_STOP
    }
    size_t index = 0;
    if (string[0] == '-' || string[0] == '+') {
        ++index;
    }
    if (!isDigitCharacter(string[index])) {
        // at some point need to figure out how to get to this line
        return false;  // LCOV_EXCL_LINE
    }
    ++index;
    while (index < string.length()) {
        if (!isDigitCharacter(string[index])) {
            if (string[index] == '.' || string[index] == 'e' ||
                string[index] == 'E') {
                if (index + 1 < string.length()) {
                    if (isDigitCharacter(string[index + 1]) ||
                        string[index + 1] == '-' || string[index + 1] == '+') {
                        return false;
                    }
                }
            }
            return true;
        }
        ++index;
    }
    return true;
}